

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decrypt_esni
              (ptls_context_t *ctx,ptls_iovec_t *server_name,st_ptls_esni_secret_t **secret,
              st_ptls_client_hello_t *ch)

{
  st_ptls_esni_secret_t **ppsVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  ptls_iovec_t pVar5;
  st_ptls_esni_secret_t *local_90;
  st_ptls_esni_secret_t *local_88;
  undefined1 local_80 [8];
  ptls_iovec_t found_name;
  uint8_t *end;
  uint8_t *src;
  size_t i;
  ptls_aead_context_t *ppStack_50;
  int ret;
  ptls_aead_context_t *aead;
  uint8_t *decrypted;
  ptls_key_exchange_context_t **key_share_ctx;
  ptls_esni_context_t **esni;
  st_ptls_client_hello_t *ch_local;
  st_ptls_esni_secret_t **secret_local;
  ptls_iovec_t *server_name_local;
  ptls_context_t *ctx_local;
  
  aead = (ptls_aead_context_t *)0x0;
  ppStack_50 = (ptls_aead_context_t *)0x0;
  esni = (ptls_esni_context_t **)ch;
  ch_local = (st_ptls_client_hello_t *)secret;
  secret_local = (st_ptls_esni_secret_t **)server_name;
  server_name_local = (ptls_iovec_t *)ctx;
  if (*secret != (st_ptls_esni_secret_t *)0x0) {
    __assert_fail("*secret == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0xba0,
                  "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, struct st_ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                 );
  }
  puVar3 = (uint8_t *)malloc(200);
  ch_local->random_bytes = puVar3;
  if (puVar3 == (uint8_t *)0x0) {
    ctx_local._4_4_ = 0x201;
  }
  else {
    memset(ch_local->random_bytes,0,200);
    for (key_share_ctx = (ptls_key_exchange_context_t **)server_name_local[3].base;
        *key_share_ctx != (ptls_key_exchange_context_t *)0x0; key_share_ctx = key_share_ctx + 1) {
      src = (uint8_t *)0x0;
      while ((*(long *)(((*key_share_ctx)->pubkey).base + (long)src * 0x48) != 0 &&
             (**(short **)(((*key_share_ctx)->pubkey).base + (long)src * 0x48) !=
              *(short *)&esni[0x13]->key_exchanges))) {
        src = src + 1;
      }
      if (*(long *)(((*key_share_ctx)->pubkey).base + (long)src * 0x48) == 0) {
        i._4_4_ = 0x2f;
        goto LAB_001277c7;
      }
      iVar2 = memcmp(((*key_share_ctx)->pubkey).base + (long)src * 0x48 + 8,esni[0x17],
                     *(size_t *)(*(long *)&esni[0x13]->padded_length + 8));
      if (iVar2 == 0) break;
    }
    if (*key_share_ctx == (ptls_key_exchange_context_t *)0x0) {
      i._4_4_ = 0x2f;
    }
    else {
      for (decrypted = (uint8_t *)(*key_share_ctx)->algo;
          (*(long *)decrypted != 0 &&
          (*(short *)**(undefined8 **)decrypted != *(short *)&esni[0x14]->key_exchanges));
          decrypted = decrypted + 8) {
      }
      if (*(long *)decrypted == 0) {
        i._4_4_ = 0x2f;
      }
      else {
        i._4_4_ = build_esni_contents_hash
                            (*(ptls_hash_algorithm_t **)&esni[0x13]->padded_length,
                             ch_local->random_bytes + 0x20,(uint8_t *)esni[0x17],
                             *(uint16_t *)&esni[0x14]->key_exchanges,*(ptls_iovec_t *)(esni + 0x15),
                             (uint8_t *)*esni);
        if ((i._4_4_ == 0) &&
           (i._4_4_ = (**(code **)(*(long *)decrypted + 0x18))
                                (decrypted,0,ch_local->random_bytes,esni[0x15],esni[0x16]),
           i._4_4_ == 0)) {
          if ((long)esni[0x19] - *(long *)(esni[0x13]->cipher_suites->record_digest + 0x20) ==
              (long)(int)((ushort)((*key_share_ctx)->pubkey).len + 0x10)) {
            aead = (ptls_aead_context_t *)
                   malloc((long)(int)((ushort)((*key_share_ctx)->pubkey).len + 0x10));
            if (aead == (ptls_aead_context_t *)0x0) {
              i._4_4_ = 0x201;
            }
            else {
              i._4_4_ = create_esni_aead(&stack0xffffffffffffffb0,0,
                                         (ptls_cipher_suite_t *)esni[0x13],
                                         *(ptls_iovec_t *)ch_local->random_bytes,
                                         ch_local->random_bytes + 0x20);
              if (i._4_4_ == 0) {
                sVar4 = ptls_aead_decrypt(ppStack_50,aead,esni[0x18],(size_t)esni[0x19],0,esni[10],
                                          (size_t)esni[0xb]);
                if (sVar4 == (long)(int)((ushort)((*key_share_ctx)->pubkey).len + 0x10)) {
                  ptls_aead_free(ppStack_50);
                  ppStack_50 = (ptls_aead_context_t *)0x0;
                  end = (uint8_t *)aead;
                  found_name.len =
                       (size_t)(aead->static_iv +
                               (long)(int)(uint)(ushort)((*key_share_ctx)->pubkey).len + -8);
                  if ((long)(found_name.len - (long)aead) < 0x10) {
                    i._4_4_ = 0x2f;
                  }
                  else {
                    puVar3 = ch_local->random_bytes;
                    *(st_ptls_aead_algorithm_t **)(puVar3 + 0x10) = aead->algo;
                    *(undefined8 *)(puVar3 + 0x18) = *(undefined8 *)aead->static_iv;
                    end = aead->static_iv + 8;
                    i._4_4_ = client_hello_decode_server_name
                                        ((ptls_iovec_t *)local_80,&end,(uint8_t *)found_name.len);
                    if (i._4_4_ == 0) {
                      for (; end != (uint8_t *)found_name.len; end = end + 1) {
                        if (*end != '\0') {
                          i._4_4_ = 0x2f;
                          goto LAB_001277c7;
                        }
                      }
                      memmove(aead,(void *)local_80,(size_t)found_name.base);
                      ppsVar1 = secret_local;
                      pVar5 = ptls_iovec_init(aead,(size_t)found_name.base);
                      local_90 = (st_ptls_esni_secret_t *)pVar5.base;
                      *ppsVar1 = local_90;
                      local_88 = (st_ptls_esni_secret_t *)pVar5.len;
                      ppsVar1[1] = local_88;
                      aead = (ptls_aead_context_t *)0x0;
                      i._4_4_ = 0;
                    }
                  }
                }
                else {
                  i._4_4_ = 0x33;
                }
              }
            }
          }
          else {
            i._4_4_ = 0x2f;
          }
        }
      }
    }
LAB_001277c7:
    if (aead != (ptls_aead_context_t *)0x0) {
      free(aead);
    }
    if (ppStack_50 != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(ppStack_50);
    }
    if ((i._4_4_ != 0) && (ch_local->random_bytes != (uint8_t *)0x0)) {
      free_esni_secret((st_ptls_esni_secret_t **)ch_local,1);
    }
    ctx_local._4_4_ = i._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static int client_hello_decrypt_esni(ptls_context_t *ctx, ptls_iovec_t *server_name, struct st_ptls_esni_secret_t **secret,
                                     struct st_ptls_client_hello_t *ch)
{
    ptls_esni_context_t **esni;
    ptls_key_exchange_context_t **key_share_ctx;
    uint8_t *decrypted = NULL;
    ptls_aead_context_t *aead = NULL;
    int ret;

    /* allocate secret */
    assert(*secret == NULL);
    if ((*secret = malloc(sizeof(**secret))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    memset(*secret, 0, sizeof(**secret));

    /* find the matching esni structure */
    for (esni = ctx->esni; *esni != NULL; ++esni) {
        size_t i;
        for (i = 0; (*esni)->cipher_suites[i].cipher_suite != NULL; ++i)
            if ((*esni)->cipher_suites[i].cipher_suite->id == ch->esni.cipher->id)
                break;
        if ((*esni)->cipher_suites[i].cipher_suite == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        if (memcmp((*esni)->cipher_suites[i].record_digest, ch->esni.record_digest, ch->esni.cipher->hash->digest_size) == 0)
            break;
    }
    if (*esni == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* find the matching private key for ESNI decryption */
    for (key_share_ctx = (*esni)->key_exchanges; *key_share_ctx != NULL; ++key_share_ctx)
        if ((*key_share_ctx)->algo->id == ch->esni.key_share->id)
            break;
    if (*key_share_ctx == NULL) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    /* calculate ESNIContents */
    if ((ret = build_esni_contents_hash(ch->esni.cipher->hash, (*secret)->esni_contents_hash, ch->esni.record_digest,
                                        ch->esni.key_share->id, ch->esni.peer_key, ch->random_bytes)) != 0)
        goto Exit;
    /* derive the shared secret */
    if ((ret = (*key_share_ctx)->on_exchange(key_share_ctx, 0, &(*secret)->secret, ch->esni.peer_key)) != 0)
        goto Exit;
    /* decrypt */
    if (ch->esni.encrypted_sni.len - ch->esni.cipher->aead->tag_size != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    if ((decrypted = malloc((*esni)->padded_length + PTLS_ESNI_NONCE_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((ret = create_esni_aead(&aead, 0, ch->esni.cipher, (*secret)->secret, (*secret)->esni_contents_hash)) != 0)
        goto Exit;
    if (ptls_aead_decrypt(aead, decrypted, ch->esni.encrypted_sni.base, ch->esni.encrypted_sni.len, 0, ch->key_shares.base,
                          ch->key_shares.len) != (*esni)->padded_length + PTLS_ESNI_NONCE_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ptls_aead_free(aead);
    aead = NULL;

    { /* decode sni */
        const uint8_t *src = decrypted, *const end = src + (*esni)->padded_length;
        ptls_iovec_t found_name;
        if (end - src < PTLS_ESNI_NONCE_SIZE) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        memcpy((*secret)->nonce, src, PTLS_ESNI_NONCE_SIZE);
        src += PTLS_ESNI_NONCE_SIZE;
        if ((ret = client_hello_decode_server_name(&found_name, &src, end)) != 0)
            goto Exit;
        for (; src != end; ++src) {
            if (*src != '\0') {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        }
        /* if successful, reuse memory allocated for padded_server_name for storing the found name (freed by the caller) */
        memmove(decrypted, found_name.base, found_name.len);
        *server_name = ptls_iovec_init(decrypted, found_name.len);
        decrypted = NULL;
    }

    ret = 0;
Exit:
    if (decrypted != NULL)
        free(decrypted);
    if (aead != NULL)
        ptls_aead_free(aead);
    if (ret != 0 && *secret != NULL)
        free_esni_secret(secret, 1);
    return ret;
}